

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O2

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
RecordManager::FindandDelete
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          RecordManager *this,STMT *S)

{
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_e0;
  undefined1 local_b0 [72];
  undefined1 local_68 [72];
  
  STMT::STMT((STMT *)local_68,S);
  FindSuchRecord(__return_storage_ptr__,this,(STMT *)local_68);
  std::__cxx11::string::~string((string *)(local_68 + 8));
  STMT::STMT((STMT *)local_b0,S);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::_Rb_tree
            (&local_e0,&__return_storage_ptr__->_M_t);
  DeleteSuchRecord(this,(STMT *)local_b0,
                   (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_e0);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_e0);
  std::__cxx11::string::~string((string *)(local_b0 + 8));
  return __return_storage_ptr__;
}

Assistant:

set<Addr> RecordManager::FindandDelete(STMT S) {
	set<Addr> target = this->FindSuchRecord(S);
	this->DeleteSuchRecord(S, target);
	return target;
}